

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeLlvm.cpp
# Opt level: O1

LLVMValueRef CompileLlvmBinaryOp(LlvmCompilationContext *ctx,ExprBinaryOp *node)

{
  int iVar1;
  ExpressionContext *pEVar2;
  bool bVar3;
  TypeBase *pTVar4;
  TypeBase *pTVar5;
  long lVar6;
  LLVMValueRef pLVar7;
  
  CompileLlvm(ctx,node->lhs);
  iVar1 = *(int *)&(node->super_ExprBase).field_0x2c;
  if ((iVar1 == 0x13) || (iVar1 == 0x12)) {
    pTVar5 = node->lhs->type;
    pEVar2 = ctx->ctx;
    lVar6 = 0x89d8;
    if ((pEVar2->typeBool == pTVar5) ||
       ((pEVar2->typeChar == pTVar5 || (pEVar2->typeShort == pTVar5)))) {
LAB_0026bf8d:
      pTVar5 = *(TypeBase **)((long)(pEVar2->uniqueDependencies).little + lVar6 + -0x30);
    }
    else if (pEVar2->typeFloat == pTVar5) {
      lVar6 = 0x89f0;
      goto LAB_0026bf8d;
    }
    CompileLlvmType(ctx,pTVar5);
    CompileLlvm(ctx,node->rhs);
    pTVar5 = node->rhs->type;
    pEVar2 = ctx->ctx;
    lVar6 = 0x89d8;
    if (((pEVar2->typeBool == pTVar5) || (pEVar2->typeChar == pTVar5)) ||
       (pEVar2->typeShort == pTVar5)) {
LAB_0026bfde:
      pTVar5 = *(TypeBase **)((long)(pEVar2->uniqueDependencies).little + lVar6 + -0x30);
    }
    else if (pEVar2->typeFloat == pTVar5) {
      lVar6 = 0x89f0;
      goto LAB_0026bfde;
    }
    CompileLlvmType(ctx,pTVar5);
    CompileLlvmType(ctx,ctx->ctx->typeInt);
    CompileLlvmType(ctx,ctx->ctx->typeInt);
    CompileLlvmType(ctx,ctx->ctx->typeInt);
    pLVar7 = (LLVMValueRef)&placeholderValue;
    goto LAB_0026c1b7;
  }
  CompileLlvm(ctx,node->rhs);
  bVar3 = true;
  pLVar7 = (LLVMValueRef)0x0;
  switch(*(undefined4 *)&(node->super_ExprBase).field_0x2c) {
  case 1:
  case 2:
  case 3:
  case 4:
  case 5:
    ExpressionContext::IsIntegerType(ctx->ctx,node->lhs->type);
    break;
  case 6:
    pTVar5 = (node->super_ExprBase).type;
    pTVar4 = GetStackType(ctx,pTVar5);
    pEVar2 = ctx->ctx;
    if (((pTVar4 != pEVar2->typeInt) &&
        (((pTVar5 == (TypeBase *)0x0 || (pTVar5->typeID != 0x19)) && (pTVar4 != pEVar2->typeLong))))
       && (pTVar4 != pEVar2->typeDouble)) {
      __assert_fail("!\"unknown operand type\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeLlvm.cpp"
                    ,0x4e8,
                    "LLVMValueRef CompileLlvmBinaryOp(LlvmCompilationContext &, ExprBinaryOp *)");
    }
    goto LAB_0026c1b1;
  case 7:
  case 8:
  case 0xf:
  case 0x10:
  case 0x11:
    break;
  case 9:
  case 10:
  case 0xb:
  case 0xc:
    ExpressionContext::IsIntegerType(ctx->ctx,node->lhs->type);
    goto LAB_0026c198;
  case 0xd:
  case 0xe:
    pTVar5 = node->lhs->type;
    if ((((pTVar5 != (TypeBase *)0x0) && (pTVar5->typeID == 0x12)) ||
        ((bVar3 = ExpressionContext::IsIntegerType(ctx->ctx,pTVar5), bVar3 ||
         ((pTVar5 = node->lhs->type, pTVar5 != (TypeBase *)0x0 && (pTVar5->typeID == 0x19)))))) ||
       (pTVar5 == ctx->ctx->typeTypeID)) goto LAB_0026c198;
    pTVar5 = ctx->ctx->typeInt;
    goto LAB_0026c1a2;
  default:
    goto switchD_0026c058_caseD_12;
  case 0x14:
    pTVar5 = GetStackType(ctx,node->lhs->type);
    CompileLlvmType(ctx,pTVar5);
    pTVar5 = GetStackType(ctx,node->rhs->type);
    CompileLlvmType(ctx,pTVar5);
LAB_0026c198:
    pTVar5 = ctx->ctx->typeInt;
LAB_0026c1a2:
    CompileLlvmType(ctx,pTVar5);
  }
LAB_0026c1b1:
  pLVar7 = (LLVMValueRef)&placeholderValue;
  bVar3 = false;
switchD_0026c058_caseD_12:
  if (bVar3) {
    __assert_fail("result",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeLlvm.cpp"
                  ,0x529,
                  "LLVMValueRef CompileLlvmBinaryOp(LlvmCompilationContext &, ExprBinaryOp *)");
  }
LAB_0026c1b7:
  pLVar7 = CheckType(ctx,&node->super_ExprBase,pLVar7);
  return pLVar7;
}

Assistant:

LLVMValueRef CompileLlvmBinaryOp(LlvmCompilationContext &ctx, ExprBinaryOp *node)
{
	LLVMValueRef lhs = CompileLlvm(ctx, node->lhs);

	if(node->op == SYN_BINARY_OP_LOGICAL_AND)
	{
		LLVMBasicBlockRef checkRhsBlock = LLVMAppendBasicBlockInContext(ctx.context, ctx.currentFunction, "land_check_rhs");
		LLVMBasicBlockRef storeOneBlock = LLVMAppendBasicBlockInContext(ctx.context, ctx.currentFunction, "land_store_1");
		LLVMBasicBlockRef storeZeroBlock = LLVMAppendBasicBlockInContext(ctx.context, ctx.currentFunction, "land_store_0");
		LLVMBasicBlockRef exitBlock = LLVMAppendBasicBlockInContext(ctx.context, ctx.currentFunction, "land_exit");

		lhs = LLVMBuildICmp(ctx.builder, LLVMIntNE, lhs, LLVMConstInt(CompileLlvmType(ctx, GetStackType(ctx, node->lhs->type)), 0, true), "");

		LLVMBuildCondBr(ctx.builder, lhs, checkRhsBlock, storeZeroBlock);

		LLVMPositionBuilderAtEnd(ctx.builder, checkRhsBlock);

		LLVMValueRef rhs = CompileLlvm(ctx, node->rhs);

		rhs = LLVMBuildICmp(ctx.builder, LLVMIntNE, rhs, LLVMConstInt(CompileLlvmType(ctx, GetStackType(ctx, node->rhs->type)), 0, true), "");

		LLVMBuildCondBr(ctx.builder, lhs, storeOneBlock, storeZeroBlock);

		LLVMPositionBuilderAtEnd(ctx.builder, storeOneBlock);

		LLVMBuildBr(ctx.builder, exitBlock);

		LLVMPositionBuilderAtEnd(ctx.builder, storeZeroBlock);

		LLVMBuildBr(ctx.builder, exitBlock);

		LLVMPositionBuilderAtEnd(ctx.builder, exitBlock);

		LLVMValueRef phi = LLVMBuildPhi(ctx.builder, CompileLlvmType(ctx, ctx.ctx.typeInt), "land");

		LLVMValueRef values[] = { LLVMConstInt(CompileLlvmType(ctx, ctx.ctx.typeInt), 1, true), LLVMConstInt(CompileLlvmType(ctx, ctx.ctx.typeInt), 0, true) };
		LLVMBasicBlockRef blocks[] = { storeOneBlock, storeZeroBlock };

		LLVMAddIncoming(phi, values, blocks, 2);

		return CheckType(ctx, node, phi);
	}

	if(node->op == SYN_BINARY_OP_LOGICAL_OR)
	{
		LLVMBasicBlockRef checkRhsBlock = LLVMAppendBasicBlockInContext(ctx.context, ctx.currentFunction, "lor_check_rhs");
		LLVMBasicBlockRef storeOneBlock = LLVMAppendBasicBlockInContext(ctx.context, ctx.currentFunction, "lor_store_1");
		LLVMBasicBlockRef storeZeroBlock = LLVMAppendBasicBlockInContext(ctx.context, ctx.currentFunction, "lor_store_0");
		LLVMBasicBlockRef exitBlock = LLVMAppendBasicBlockInContext(ctx.context, ctx.currentFunction, "lor_exit");

		lhs = LLVMBuildICmp(ctx.builder, LLVMIntNE, lhs, LLVMConstInt(CompileLlvmType(ctx, GetStackType(ctx, node->lhs->type)), 0, true), "");

		LLVMBuildCondBr(ctx.builder, lhs, storeOneBlock, checkRhsBlock);

		LLVMPositionBuilderAtEnd(ctx.builder, checkRhsBlock);

		LLVMValueRef rhs = CompileLlvm(ctx, node->rhs);

		rhs = LLVMBuildICmp(ctx.builder, LLVMIntNE, rhs, LLVMConstInt(CompileLlvmType(ctx, GetStackType(ctx, node->rhs->type)), 0, true), "");

		LLVMBuildCondBr(ctx.builder, lhs, storeOneBlock, storeZeroBlock);

		LLVMPositionBuilderAtEnd(ctx.builder, storeOneBlock);

		LLVMBuildBr(ctx.builder, exitBlock);

		LLVMPositionBuilderAtEnd(ctx.builder, storeZeroBlock);

		LLVMBuildBr(ctx.builder, exitBlock);

		LLVMPositionBuilderAtEnd(ctx.builder, exitBlock);

		LLVMValueRef phi = LLVMBuildPhi(ctx.builder, CompileLlvmType(ctx, ctx.ctx.typeInt), "lor");

		LLVMValueRef values[] = { LLVMConstInt(CompileLlvmType(ctx, ctx.ctx.typeInt), 1, true), LLVMConstInt(CompileLlvmType(ctx, ctx.ctx.typeInt), 0, true) };
		LLVMBasicBlockRef blocks[] = { storeOneBlock, storeZeroBlock };

		LLVMAddIncoming(phi, values, blocks, 2);

		return CheckType(ctx, node, phi);
	}

	LLVMValueRef rhs = CompileLlvm(ctx, node->rhs);

	LLVMValueRef result = NULL;

	switch(node->op)
	{
	case SYN_BINARY_OP_ADD:
		if(ctx.ctx.IsIntegerType(node->lhs->type) || isType<TypeEnum>(node->lhs->type))
			result = LLVMBuildAdd(ctx.builder, lhs, rhs, "");
		else
			result = LLVMBuildFAdd(ctx.builder, lhs, rhs, "");
		break;
	case SYN_BINARY_OP_SUB:
		if(ctx.ctx.IsIntegerType(node->lhs->type) || isType<TypeEnum>(node->lhs->type))
			result = LLVMBuildSub(ctx.builder, lhs, rhs, "");
		else
			result = LLVMBuildFSub(ctx.builder, lhs, rhs, "");
		break;
	case SYN_BINARY_OP_MUL:
		if(ctx.ctx.IsIntegerType(node->lhs->type) || isType<TypeEnum>(node->lhs->type))
			result = LLVMBuildMul(ctx.builder, lhs, rhs, "");
		else
			result = LLVMBuildFMul(ctx.builder, lhs, rhs, "");
		break;
	case SYN_BINARY_OP_DIV:
		if(ctx.ctx.IsIntegerType(node->lhs->type) || isType<TypeEnum>(node->lhs->type))
			result = LLVMBuildSDiv(ctx.builder, lhs, rhs, "");
		else
			result = LLVMBuildFDiv(ctx.builder, lhs, rhs, "");
		break;
	case SYN_BINARY_OP_MOD:
		if(ctx.ctx.IsIntegerType(node->lhs->type) || isType<TypeEnum>(node->lhs->type))
			result = LLVMBuildSRem(ctx.builder, lhs, rhs, "");
		else
			result = LLVMBuildFRem(ctx.builder, lhs, rhs, "");
		break;
	case SYN_BINARY_OP_POW:
		if(GetStackType(ctx, node->type) == ctx.ctx.typeInt || isType<TypeEnum>(node->type))
		{
			LLVMValueRef arguments[] = { lhs, rhs };

			result = LLVMBuildCall(ctx.builder, LLVMGetNamedFunction(ctx.module, "__llvmPowInt"), arguments, 2, "");
		}
		else if(GetStackType(ctx, node->type) == ctx.ctx.typeLong)
		{
			LLVMValueRef arguments[] = { lhs, rhs };

			result = LLVMBuildCall(ctx.builder, LLVMGetNamedFunction(ctx.module, "__llvmPowLong"), arguments, 2, "");
		}
		else if(GetStackType(ctx, node->type) == ctx.ctx.typeDouble)
		{
			LLVMValueRef arguments[] = { lhs, rhs };

			result = LLVMBuildCall(ctx.builder, LLVMGetNamedFunction(ctx.module, "__llvmPowDouble"), arguments, 2, "");
		}
		else
		{
			assert(!"unknown operand type");
		}
		break;
	case SYN_BINARY_OP_SHL:
		result = LLVMBuildShl(ctx.builder, lhs, rhs, "");
		break;
	case SYN_BINARY_OP_SHR:
		result = LLVMBuildAShr(ctx.builder, lhs, rhs, "");
		break;
	case SYN_BINARY_OP_LESS:
		if(ctx.ctx.IsIntegerType(node->lhs->type) || isType<TypeEnum>(node->lhs->type))
			result = LLVMBuildZExt(ctx.builder, LLVMBuildICmp(ctx.builder, LLVMIntSLT, lhs, rhs, ""), CompileLlvmType(ctx, ctx.ctx.typeInt), "");
		else
			result = LLVMBuildZExt(ctx.builder, LLVMBuildFCmp(ctx.builder, LLVMRealULT, lhs, rhs, ""), CompileLlvmType(ctx, ctx.ctx.typeInt), "");
		break;
	case SYN_BINARY_OP_LESS_EQUAL:
		if(ctx.ctx.IsIntegerType(node->lhs->type) || isType<TypeEnum>(node->lhs->type))
			result = LLVMBuildZExt(ctx.builder, LLVMBuildICmp(ctx.builder, LLVMIntSLE, lhs, rhs, ""), CompileLlvmType(ctx, ctx.ctx.typeInt), "");
		else
			result = LLVMBuildZExt(ctx.builder, LLVMBuildFCmp(ctx.builder, LLVMRealULE, lhs, rhs, ""), CompileLlvmType(ctx, ctx.ctx.typeInt), "");
		break;
	case SYN_BINARY_OP_GREATER:
		if(ctx.ctx.IsIntegerType(node->lhs->type) || isType<TypeEnum>(node->lhs->type))
			result = LLVMBuildZExt(ctx.builder, LLVMBuildICmp(ctx.builder, LLVMIntSGT, lhs, rhs, ""), CompileLlvmType(ctx, ctx.ctx.typeInt), "");
		else
			result = LLVMBuildZExt(ctx.builder, LLVMBuildFCmp(ctx.builder, LLVMRealUGT, lhs, rhs, ""), CompileLlvmType(ctx, ctx.ctx.typeInt), "");
		break;
	case SYN_BINARY_OP_GREATER_EQUAL:
		if(ctx.ctx.IsIntegerType(node->lhs->type) || isType<TypeEnum>(node->lhs->type))
			result = LLVMBuildZExt(ctx.builder, LLVMBuildICmp(ctx.builder, LLVMIntSGE, lhs, rhs, ""), CompileLlvmType(ctx, ctx.ctx.typeInt), "");
		else
			result = LLVMBuildZExt(ctx.builder, LLVMBuildFCmp(ctx.builder, LLVMRealUGE, lhs, rhs, ""), CompileLlvmType(ctx, ctx.ctx.typeInt), "");
		break;
	case SYN_BINARY_OP_EQUAL:
		if(isType<TypeRef>(node->lhs->type) || ctx.ctx.IsIntegerType(node->lhs->type) || isType<TypeEnum>(node->lhs->type) || node->lhs->type == ctx.ctx.typeTypeID)
			result = LLVMBuildZExt(ctx.builder, LLVMBuildICmp(ctx.builder, LLVMIntEQ, lhs, rhs, ""), CompileLlvmType(ctx, ctx.ctx.typeInt), "");
		else
			result = LLVMBuildZExt(ctx.builder, LLVMBuildFCmp(ctx.builder, LLVMRealUEQ, lhs, rhs, ""), CompileLlvmType(ctx, ctx.ctx.typeInt), "");
		break;
	case SYN_BINARY_OP_NOT_EQUAL:
		if(isType<TypeRef>(node->lhs->type) || ctx.ctx.IsIntegerType(node->lhs->type) || isType<TypeEnum>(node->lhs->type) || node->lhs->type == ctx.ctx.typeTypeID)
			result = LLVMBuildZExt(ctx.builder, LLVMBuildICmp(ctx.builder, LLVMIntNE, lhs, rhs, ""), CompileLlvmType(ctx, ctx.ctx.typeInt), "");
		else
			result = LLVMBuildZExt(ctx.builder, LLVMBuildFCmp(ctx.builder, LLVMRealUNE, lhs, rhs, ""), CompileLlvmType(ctx, ctx.ctx.typeInt), "");
		break;
	case SYN_BINARY_OP_BIT_AND:
		result = LLVMBuildAnd(ctx.builder, lhs, rhs, "");
		break;
	case SYN_BINARY_OP_BIT_OR:
		result = LLVMBuildOr(ctx.builder, lhs, rhs, "");
		break;
	case SYN_BINARY_OP_BIT_XOR:
		result = LLVMBuildXor(ctx.builder, lhs, rhs, "");
		break;
	case SYN_BINARY_OP_LOGICAL_XOR:
		// (lhs != 0) != (rhs != 0)
		lhs = LLVMBuildICmp(ctx.builder, LLVMIntNE, lhs, LLVMConstInt(CompileLlvmType(ctx, GetStackType(ctx, node->lhs->type)), 0, true), "");
		rhs = LLVMBuildICmp(ctx.builder, LLVMIntNE, rhs, LLVMConstInt(CompileLlvmType(ctx, GetStackType(ctx, node->rhs->type)), 0, true), "");

		result = LLVMBuildZExt(ctx.builder, LLVMBuildICmp(ctx.builder, LLVMIntNE, lhs, rhs, ""), CompileLlvmType(ctx, ctx.ctx.typeInt), "");
		break;
	default:
		break;
	}

	assert(result);

	return CheckType(ctx, node, result);
}